

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

void __thiscall QUrlModel::setUrls(QUrlModel *this,QList<QUrl> *list)

{
  undefined4 uVar1;
  undefined8 in_RSI;
  QList<QUrl> *in_RDI;
  long in_FS_OFFSET;
  int in_stack_0000019c;
  QList<QUrlModel::WatchItem> *this_00;
  undefined1 move;
  QList<QUrl> *list_00;
  QUrlModel *in_stack_ffffffffffffffc8;
  QList<QUrlModel::WatchItem> local_20;
  long local_8;
  
  move = (undefined1)((ulong)in_RSI >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  list_00 = in_RDI;
  QModelIndex::QModelIndex((QModelIndex *)0x785b59);
  uVar1 = (*(code *)(in_RDI->d).d[7].super_QArrayData.alloc)();
  QModelIndex::QModelIndex((QModelIndex *)0x785b7f);
  (*(code *)(in_RDI->d).d[0x10].super_QArrayData.alloc)(in_RDI,0,uVar1,&stack0xffffffffffffffc8);
  QList<QUrl>::clear((QList<QUrl> *)this_00);
  QList<QUrlModel::WatchItem>::clear(this_00);
  addUrls(in_stack_ffffffffffffffc8,list_00,in_stack_0000019c,(bool)move);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlModel::setUrls(const QList<QUrl> &list)
{
    removeRows(0, rowCount());
    invalidUrls.clear();
    watching.clear();
    addUrls(list, 0);
}